

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenReader
          (DartGenerator *this,StructDef *struct_def,string *reader_name,string *code)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string struct_type;
  string *code_local;
  string *reader_name_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  struct_type.field_2._8_8_ = code;
  IdlNamer::Type_abi_cxx11_((string *)local_48,&this->namer_,struct_def);
  std::operator+(&local_a8,"class ",reader_name);
  std::operator+(&local_88,&local_a8," extends ");
  std::operator+(&local_68,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _kFb_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  if ((struct_def->fixed & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,".TableReader<");
  }
  else {
    std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,".StructReader<");
  }
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "> {\n");
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_118,"  const ",reader_name);
  std::operator+(&local_f8,&local_118,"();\n\n");
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  if ((struct_def->fixed & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"  @override\n");
    NumToString<unsigned_long>(&local_178,struct_def->bytesize);
    std::operator+(&local_158,"  int get size => ",&local_178);
    std::operator+(&local_138,&local_158,";\n\n");
    std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
  }
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"  @override\n");
  std::operator+(&local_1f8,"  ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_1d8,&local_1f8," createObject(fb.BufferContext bc, int offset) => \n    ");
  std::operator+(&local_1b8,&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_198,&local_1b8,"._(bc, offset);\n");
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::operator+=((string *)struct_type.field_2._8_8_,"}\n\n");
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void GenReader(const StructDef &struct_def, const std::string &reader_name,
                 std::string &code) {
    const auto struct_type = namer_.Type(struct_def);

    code += "class " + reader_name + " extends " + _kFb;
    if (struct_def.fixed) {
      code += ".StructReader<";
    } else {
      code += ".TableReader<";
    }
    code += struct_type + "> {\n";
    code += "  const " + reader_name + "();\n\n";

    if (struct_def.fixed) {
      code += "  @override\n";
      code += "  int get size => " + NumToString(struct_def.bytesize) + ";\n\n";
    }
    code += "  @override\n";
    code += "  " + struct_type +
            " createObject(fb.BufferContext bc, int offset) => \n    " +
            struct_type + "._(bc, offset);\n";
    code += "}\n\n";
  }